

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

State * __thiscall
despot::BaseTag::GetMMAP
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  
  uVar5 = MostLikelyRobPosition(this,particles);
  uVar6 = MostLikelyOpponentPosition(this,particles);
  piVar7 = (int *)&Floor::INVALID;
  piVar8 = (int *)&Floor::INVALID;
  uVar3 = (uint)uVar5;
  if (((-1 < (int)uVar3) && (piVar8 = (int *)&Floor::INVALID, -1 < (long)uVar5)) &&
     (piVar8 = (int *)&Floor::INVALID, (int)uVar3 < (this->floor_).num_cols_)) {
    piVar8 = (int *)&Floor::INVALID;
    if ((int)(uVar5 >> 0x20) < (this->floor_).num_rows_) {
      piVar8 = (this->floor_).floor_[uVar5 >> 0x20] + (uVar3 & 0x7fffffff);
    }
  }
  iVar1 = *piVar8;
  uVar3 = (uint)uVar6;
  if (((-1 < (int)uVar3) && (-1 < (long)uVar6)) &&
     (((int)uVar3 < (this->floor_).num_cols_ && ((int)(uVar6 >> 0x20) < (this->floor_).num_rows_))))
  {
    piVar7 = (this->floor_).floor_[uVar6 >> 0x20] + (uVar3 & 0x7fffffff);
  }
  iVar2 = *piVar7;
  iVar4 = despot::Floor::NumCells();
  return &(this->states_).
          super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
          super__Vector_impl_data._M_start[(long)iVar4 * (long)iVar1 + (long)iVar2]->super_State;
}

Assistant:

const State* BaseTag::GetMMAP(const vector<State*>& particles) const {
	Coord rob = MostLikelyRobPosition(particles);
	Coord opp = MostLikelyOpponentPosition(particles);

	int state_id = RobOppIndicesToStateIndex(floor_.GetIndex(rob),
		floor_.GetIndex(opp));
	return states_[state_id];
}